

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_utils.hpp
# Opt level: O2

uint64_t time_utils::parse_datetime_json(char *s)

{
  uint from;
  uint month;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint to;
  char *s_local;
  
  s_local = s;
  from = slurp_digits(&s_local,'-');
  month = slurp_digits(&s_local,'-');
  uVar1 = slurp_digits(&s_local,'T');
  uVar2 = slurp_digits(&s_local,':');
  uVar3 = slurp_digits(&s_local,':');
  uVar4 = slurp_digits(&s_local,'.');
  to = 0x5a;
  uVar5 = slurp_digits(&s_local,'Z');
  uVar6 = cumulative_days_in_years(from,to);
  uVar7 = cumulative_days_in_months_before(from,month);
  return (ulong)uVar5 +
         ((ulong)uVar4 +
         ((ulong)uVar3 + ((ulong)uVar2 + ((uVar1 - 1) + uVar6 + uVar7) * 0x18) * 0x3c) * 0x3c) *
         1000000000;
}

Assistant:

static inline
uint64_t parse_datetime_json(const char *s)
{
    const auto year = slurp_digits(s, '-');
    const auto month = slurp_digits(s, '-');
    const auto day = slurp_digits(s, 'T');
    const auto hour = slurp_digits(s, ':');
    const auto minute = slurp_digits(s, ':');
    const auto second = slurp_digits(s, '.');
    const auto nanosecond = slurp_digits(s, 'Z');

    const uint64_t total_days =
        cumulative_days_in_years(2000, year) +
        cumulative_days_in_months_before(year, month) +
        (day - 1);

    uint64_t r = total_days;

    r *= 24;
    r += hour;

    r *= 60;
    r += minute;

    r *= 60;
    r += second;

    r *= 1'000'000'000;
    r += nanosecond;

    return r;
}